

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O3

void __thiscall ArrayType::GenCleanUpCode(ArrayType *this,Output *out_cc,Env *env)

{
  bool bVar1;
  ID *pIVar2;
  Field *this_00;
  char *pcVar3;
  char *pcVar4;
  string local_48;
  
  Type::GenCleanUpCode(&this->super_Type,out_cc,env);
  bVar1 = Type::NeedsCleanUp(this->elemtype_);
  if (bVar1) {
    if (this->elem_var_field_ == (Field *)0x0) {
      pIVar2 = (ID *)operator_new(0x78);
      strfmt_abi_cxx11_(&local_48,"%s__elem",
                        (((this->super_Type).value_var_)->name)._M_dataplus._M_p);
      ID::ID(pIVar2,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      this_00 = (Field *)operator_new(0xa0);
      Field::Field(this_00,PARSE_VAR_FIELD,1,pIVar2,this->elemtype_);
      (this_00->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Field_00144108;
      this->elem_var_field_ = this_00;
      Field::Prepare(this_00,env);
    }
    pcVar3 = Env::RValue(env,(this->super_Type).value_var_);
    pIVar2 = (ID *)0x0;
    Output::println(out_cc,"if ( %s )",pcVar3);
    out_cc->indent_ = out_cc->indent_ + 1;
    Output::println(out_cc,"{");
    if (this->elem_var_field_ != (Field *)0x0) {
      pIVar2 = this->elem_var_field_->id_;
    }
    pcVar3 = Env::LValue(env,pIVar2);
    pcVar4 = Env::RValue(env,(this->super_Type).value_var_);
    Output::println(out_cc,"for ( auto* %s : *%s )",pcVar3,pcVar4);
    out_cc->indent_ = out_cc->indent_ + 1;
    Output::println(out_cc,"{");
    (*(this->elemtype_->super_DataDepElement)._vptr_DataDepElement[7])(this->elemtype_,out_cc,env);
    Output::println(out_cc,"}");
    out_cc->indent_ = out_cc->indent_ + -1;
    Output::println(out_cc,"}");
    out_cc->indent_ = out_cc->indent_ + -1;
  }
  Output::println(out_cc,"delete %s;",(this->super_Type).lvalue_._M_dataplus._M_p);
  return;
}

Assistant:

void ArrayType::GenCleanUpCode(Output* out_cc, Env* env)
	{
	Type::GenCleanUpCode(out_cc, env);
	if ( elemtype_->NeedsCleanUp() )
		{
		if ( ! elem_var_field_ )
			{
			ID* elem_var = new ID(strfmt("%s__elem", value_var()->Name()));
			elem_var_field_ = new ParseVarField(Field::NOT_CLASS_MEMBER, elem_var, elemtype_);
			elem_var_field_->Prepare(env);
			}

		out_cc->println("if ( %s )", env->RValue(value_var()));
		out_cc->inc_indent();
		out_cc->println("{");

		out_cc->println("for ( auto* %s : *%s )", env->LValue(elem_var()),
		                env->RValue(value_var()));
		out_cc->inc_indent();
		out_cc->println("{");
		elemtype_->GenCleanUpCode(out_cc, env);
		out_cc->println("}");
		out_cc->dec_indent();

		out_cc->println("}");
		out_cc->dec_indent();
		}
	out_cc->println("delete %s;", lvalue());
	}